

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.h
# Opt level: O0

void __thiscall GOESRProduct::~GOESRProduct(GOESRProduct *this)

{
  Channel *in_RDI;
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  *unaff_retaddr;
  
  std::__cxx11::string::~string((string *)in_RDI[5].nameShort.field_2._M_local_buf);
  std::__cxx11::string::~string((string *)in_RDI[4].nameLong.field_2._M_local_buf);
  std::__cxx11::string::~string((string *)in_RDI[4].nameShort.field_2._M_local_buf);
  std::__cxx11::string::~string((string *)&in_RDI[3].nameLong._M_string_length);
  Channel::~Channel(in_RDI);
  Region::~Region((Region *)in_RDI);
  Product::~Product((Product *)in_RDI);
  std::
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>::
  ~vector(unaff_retaddr);
  return;
}

Assistant:

GOESRProduct() = default;